

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void pop_activation_record_from_stack(CManager_conflict cm,ev_handler_activation_ptr rec)

{
  long lVar1;
  pthread_t pVar2;
  long in_RDI;
  pthread_t self;
  ev_handler_activation_ptr tmp;
  event_path_data evp;
  long *local_20;
  
  lVar1 = *(long *)(in_RDI + 0x118);
  pVar2 = pthread_self();
  if (*(long *)(lVar1 + 0xc0) == 0) {
    printf("Activation stack inconsistency!  No records!\n");
  }
  else if (*(pthread_t *)(*(long *)(lVar1 + 0xc0) + 8) == pVar2) {
    *(undefined8 *)(lVar1 + 0xc0) = *(undefined8 *)(*(long *)(lVar1 + 0xc0) + 0x18);
    if (*(long *)(lVar1 + 0xc0) != 0) {
      **(undefined8 **)(lVar1 + 0xc0) = 0;
    }
  }
  else {
    for (local_20 = *(long **)(*(long *)(lVar1 + 0xc0) + 0x18); local_20 != (long *)0x0;
        local_20 = (long *)local_20[3]) {
      if (local_20[1] == pVar2) {
        *(long *)(*local_20 + 0x18) = local_20[3];
        if (local_20[3] == 0) {
          return;
        }
        *(long *)local_20[3] = *local_20;
        return;
      }
    }
    printf("Activation stack inconsistency!  Record with thread ID now found!\n");
  }
  return;
}

Assistant:

static void
pop_activation_record_from_stack(CManager cm, ev_handler_activation_ptr rec)
{
    event_path_data evp = cm->evp;
    ev_handler_activation_ptr tmp;
    thr_thread_id self = thr_thread_self();
    if (!evp->activation_stack) {
	printf("Activation stack inconsistency!  No records!\n"); 
	return;
    }
    if (evp->activation_stack->thread_id == self) {
	evp->activation_stack = evp->activation_stack->next;
	if (evp->activation_stack) {
	    evp->activation_stack->prev = NULL;
	}
	return;
    }
    tmp = evp->activation_stack->next;
    while(tmp) {
	if (tmp->thread_id == self) {
	    tmp->prev->next = tmp->next;
	    if (tmp->next) {
		tmp->next->prev = tmp->prev;
	    }
	    return;
	}
	tmp = tmp->next;
    }
    printf("Activation stack inconsistency!  Record with thread ID now found!\n"); 
}